

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer3.cpp
# Opt level: O0

int main(void)

{
  reference_wrapper<Consumer> local_128;
  thread local_120;
  thread consThr;
  thread local_110;
  thread prodThr;
  Consumer cons;
  undefined1 local_f0 [8];
  Producer prod;
  Queue<int> q;
  
  rtb::Concurrency::Queue<int>::Queue((Queue<int> *)&prod.outputQueue_);
  Producer::Producer((Producer *)local_f0,10,(Queue<int> *)&prod.outputQueue_);
  Consumer::Consumer((Consumer *)&prodThr,(Queue<int> *)&prod.outputQueue_);
  consThr._M_id._M_thread = (id)std::ref<Producer>((Producer *)local_f0);
  std::thread::thread<std::reference_wrapper<Producer>,,void>
            (&local_110,(reference_wrapper<Producer> *)&consThr);
  local_128 = std::ref<Consumer>((Consumer *)&prodThr);
  std::thread::thread<std::reference_wrapper<Consumer>,,void>(&local_120,&local_128);
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&local_120);
  std::thread::~thread(&local_110);
  rtb::Concurrency::Queue<int>::~Queue((Queue<int> *)&prod.outputQueue_);
  return 0;
}

Assistant:

int main() {
    // Define the queue as a variable in the main scope
    Queue<int> q;

    Producer prod(10, q);
    Consumer cons(q);

    // Run `produce` function on a new thread providing a function argument
    std::thread prodThr(std::ref(prod));
    // Run `consume` function on a new thread
    std::thread consThr(std::ref(cons));

    // Wait for the threads to terminate before exiting the main function
    prodThr.join();
    consThr.join();

    return 0;
}